

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix33<float> * __thiscall
Imath_3_2::Matrix33<float>::operator*=(Matrix33<float> *this,Matrix33<float> *v)

{
  float *in_RSI;
  Matrix33<float> *in_RDI;
  Matrix33<float> tmp;
  Matrix33<float> local_34;
  float *local_10;
  
  local_10 = in_RSI;
  Matrix33(&local_34,UNINITIALIZED);
  local_34.x[0][0] =
       in_RDI->x[0][2] * local_10[6] + in_RDI->x[0][0] * *local_10 + in_RDI->x[0][1] * local_10[3];
  local_34.x[0][1] =
       in_RDI->x[0][2] * local_10[7] + in_RDI->x[0][0] * local_10[1] + in_RDI->x[0][1] * local_10[4]
  ;
  local_34.x[0][2] =
       in_RDI->x[0][2] * local_10[8] + in_RDI->x[0][0] * local_10[2] + in_RDI->x[0][1] * local_10[5]
  ;
  local_34.x[1][0] =
       in_RDI->x[1][2] * local_10[6] + in_RDI->x[1][0] * *local_10 + in_RDI->x[1][1] * local_10[3];
  local_34.x[1][1] =
       in_RDI->x[1][2] * local_10[7] + in_RDI->x[1][0] * local_10[1] + in_RDI->x[1][1] * local_10[4]
  ;
  local_34.x[1][2] =
       in_RDI->x[1][2] * local_10[8] + in_RDI->x[1][0] * local_10[2] + in_RDI->x[1][1] * local_10[5]
  ;
  local_34.x[2][0] =
       in_RDI->x[2][2] * local_10[6] + in_RDI->x[2][0] * *local_10 + in_RDI->x[2][1] * local_10[3];
  local_34.x[2][1] =
       in_RDI->x[2][2] * local_10[7] + in_RDI->x[2][0] * local_10[1] + in_RDI->x[2][1] * local_10[4]
  ;
  local_34.x[2][2] =
       in_RDI->x[2][2] * local_10[8] + in_RDI->x[2][0] * local_10[2] + in_RDI->x[2][1] * local_10[5]
  ;
  operator=(in_RDI,&local_34);
  return in_RDI;
}

Assistant:

const Matrix33<T>&
Matrix33<T>::operator*= (const Matrix33<T>& v) IMATH_NOEXCEPT
{
    // Avoid initializing with 0 values before immediately overwriting them,
    // and unroll all loops for the best autovectorization.
    Matrix33 tmp (IMATH_INTERNAL_NAMESPACE::UNINITIALIZED);

    tmp.x[0][0] =
        x[0][0] * v.x[0][0] + x[0][1] * v.x[1][0] + x[0][2] * v.x[2][0];
    tmp.x[0][1] =
        x[0][0] * v.x[0][1] + x[0][1] * v.x[1][1] + x[0][2] * v.x[2][1];
    tmp.x[0][2] =
        x[0][0] * v.x[0][2] + x[0][1] * v.x[1][2] + x[0][2] * v.x[2][2];

    tmp.x[1][0] =
        x[1][0] * v.x[0][0] + x[1][1] * v.x[1][0] + x[1][2] * v.x[2][0];
    tmp.x[1][1] =
        x[1][0] * v.x[0][1] + x[1][1] * v.x[1][1] + x[1][2] * v.x[2][1];
    tmp.x[1][2] =
        x[1][0] * v.x[0][2] + x[1][1] * v.x[1][2] + x[1][2] * v.x[2][2];

    tmp.x[2][0] =
        x[2][0] * v.x[0][0] + x[2][1] * v.x[1][0] + x[2][2] * v.x[2][0];
    tmp.x[2][1] =
        x[2][0] * v.x[0][1] + x[2][1] * v.x[1][1] + x[2][2] * v.x[2][1];
    tmp.x[2][2] =
        x[2][0] * v.x[0][2] + x[2][1] * v.x[1][2] + x[2][2] * v.x[2][2];

    *this = tmp;
    return *this;
}